

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar_ddd_open_list.hpp
# Opt level: O2

void __thiscall
astar_ddd::AstarDDDOpenList<Node<Tiles>_>::clear(AstarDDDOpenList<Node<Tiles>_> *this)

{
  named_fstream *pnVar1;
  
  std::
  vector<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
  ::clear(&this->open_buckets);
  std::
  vector<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
  ::clear(&this->next_buckets);
  std::
  vector<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>,_std::allocator<std::unique_ptr<named_fstream,_std::default_delete<named_fstream>_>_>_>
  ::clear(&this->closed_buckets);
  pnVar1 = (this->recursive_bucket)._M_t.
           super___uniq_ptr_impl<named_fstream,_std::default_delete<named_fstream>_>._M_t.
           super__Tuple_impl<0UL,_named_fstream_*,_std::default_delete<named_fstream>_>.
           super__Head_base<0UL,_named_fstream_*,_false>._M_head_impl;
  (this->recursive_bucket)._M_t.
  super___uniq_ptr_impl<named_fstream,_std::default_delete<named_fstream>_>._M_t.
  super__Tuple_impl<0UL,_named_fstream_*,_std::default_delete<named_fstream>_>.
  super__Head_base<0UL,_named_fstream_*,_false>._M_head_impl = (named_fstream *)0x0;
  if (pnVar1 != (named_fstream *)0x0) {
    (**(code **)(*(long *)pnVar1 + 8))();
  }
  rmdir("open_list_buckets");
  dfpair(_stdout,"max bucket size (bytes)","%lu",this->max_bucket_size_in_bytes);
  return;
}

Assistant:

void AstarDDDOpenList<Entry>::clear() {
        open_buckets.clear();
        next_buckets.clear();
        closed_buckets.clear();
        recursive_bucket = nullptr;
        // remove empty directory, this fails if directory is not empty
        rmdir("open_list_buckets");
        dfpair(stdout, "max bucket size (bytes)", "%lu", max_bucket_size_in_bytes);
    }